

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::RBFKernel::ByteSizeLong(RBFKernel *this)

{
  uint uVar1;
  
  uVar1 = -(uint)(this->gamma_ != 0.0) & 1;
  this->_cached_size_ = uVar1 * 9;
  return (ulong)uVar1 * 9;
}

Assistant:

size_t RBFKernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RBFKernel)
  size_t total_size = 0;

  // double gamma = 1;
  if (this->gamma() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}